

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc_priv.h
# Opt level: O2

void hooked_regions_check_single(list_item *cur,uint64_t start,uint64_t length)

{
  void *pvVar1;
  gpointer pvVar2;
  uint64_t *key;
  uint64_t local_40;
  uint64_t local_38;
  
  for (; cur != (list_item *)0x0; cur = cur->next) {
    pvVar1 = cur->data;
    if ((*(ulong *)((long)pvVar1 + 0x20) < *(ulong *)((long)pvVar1 + 0x18) ||
         start <= *(ulong *)((long)pvVar1 + 0x20) && *(ulong *)((long)pvVar1 + 0x18) <= start) &&
       (*(char *)((long)pvVar1 + 0x14) == '\0')) {
      local_40 = start;
      local_38 = length;
      pvVar2 = g_hash_table_lookup(*(GHashTable **)((long)pvVar1 + 0x38),&local_40);
      if (pvVar2 == (gpointer)0x0) {
        key = (uint64_t *)malloc(0x10);
        *key = start;
        key[1] = length;
        g_hash_table_insert(*(GHashTable **)((long)pvVar1 + 0x38),key,&DAT_00000001);
      }
    }
  }
  return;
}

Assistant:

static inline void hooked_regions_check_single(struct list_item *cur,
                                               uint64_t start, uint64_t length)
{
    while (cur != NULL) {
        if (HOOK_BOUND_CHECK((struct hook *)cur->data, start)) {
            hooked_regions_add((struct hook *)cur->data, start, length);
        }
        cur = cur->next;
    }
}